

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O0

void rw::ps2::calcTEX1(Raster *raster,uint64 *tex1,int32 filter)

{
  uint64 l;
  uint64 k;
  uint64 t1;
  Ps2Raster *natras;
  int32 filter_local;
  uint64 *tex1_local;
  Raster *raster_local;
  
  k = (ulong)*(byte *)((long)&raster->privateFlags + (long)nativeRasterOffset + 2) |
      (ulong)(*(ushort *)((long)&raster->privateFlags + (long)nativeRasterOffset) & 0xfff) << 0x20 |
      (ulong)(*(uint *)((long)&raster->privateFlags + (long)nativeRasterOffset) >> 0xc & 3) << 0x13;
  switch(filter) {
  case 1:
    break;
  case 2:
    k = k | 0x60;
    break;
  case 3:
    k = k | 0x80;
    break;
  case 4:
    k = k | 0x120;
    break;
  case 5:
    k = k | 0xc0;
    break;
  case 6:
    k = k | 0x160;
  }
  *tex1 = k;
  return;
}

Assistant:

void
calcTEX1(Raster *raster, uint64 *tex1, int32 filter)
{
	enum {
		NEAREST = 0,
		LINEAR,
		NEAREST_MIPMAP_NEAREST,
		NEAREST_MIPMAP_LINEAR,
		LINEAR_MIPMAP_NEAREST,
		LINEAR_MIPMAP_LINEAR,
	};
	Ps2Raster *natras = GETPS2RASTEREXT(raster);
	uint64 t1 = natras->tex1low;
	uint64 k = natras->kl & 0xFFF;
	uint64 l = (natras->kl >> 12) & 0x3;
	t1 |= k << 32;
	t1 |= l << 19;
	switch(filter){
	case Texture::NEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST << 6);
		break;
	case Texture::LINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR << 6);
		break;
	case Texture::MIPNEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST_MIPMAP_NEAREST << 6);
		break;
	case Texture::MIPLINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR_MIPMAP_NEAREST << 6);
		break;
	case Texture::LINEARMIPNEAREST:
		t1 |= (NEAREST << 5) |
		      (NEAREST_MIPMAP_LINEAR << 6);
		break;
	case Texture::LINEARMIPLINEAR:
		t1 |= (LINEAR << 5) |
		      (LINEAR_MIPMAP_LINEAR << 6);
		break;
	}
	*tex1 = t1;
}